

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

void train(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *args)

{
  element_type *peVar1;
  bool bVar2;
  char cVar3;
  int64_t iVar4;
  invalid_argument *this;
  shared_ptr<fasttext::FastText> fasttext;
  Autotune autotune;
  string outputFileName;
  ofstream ofs;
  Args a;
  shared_ptr<fasttext::FastText> local_428;
  _Any_data local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_408 [3];
  string local_3d0;
  long *local_3b0;
  filebuf local_3a8 [8];
  long local_3a0 [29];
  ios_base local_2b8 [264];
  Args local_1b0;
  
  ::fasttext::Args::Args(&local_1b0);
  ::fasttext::Args::parseArgs(&local_1b0,args);
  local_428.super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (FastText *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<fasttext::FastText,std::allocator<fasttext::FastText>>
            (&local_428.super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(FastText **)&local_428,(allocator<fasttext::FastText> *)&local_3b0);
  local_3d0._M_string_length = 0;
  local_3d0.field_2._M_local_buf[0] = '\0';
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  bVar2 = ::fasttext::Args::hasAutotune(&local_1b0);
  if (bVar2) {
    iVar4 = ::fasttext::Args::getAutotuneModelSize(&local_1b0);
    if (iVar4 != -1) {
      local_3b0 = local_3a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3b0,local_1b0.output._M_dataplus._M_p,
                 local_1b0.output._M_dataplus._M_p + local_1b0.output._M_string_length);
      std::__cxx11::string::append((char *)&local_3b0);
      goto LAB_0011d05e;
    }
  }
  local_3b0 = local_3a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3b0,local_1b0.output._M_dataplus._M_p,
             local_1b0.output._M_dataplus._M_p + local_1b0.output._M_string_length);
  std::__cxx11::string::append((char *)&local_3b0);
LAB_0011d05e:
  std::__cxx11::string::operator=((string *)&local_3d0,(string *)&local_3b0);
  if (local_3b0 != local_3a0) {
    operator_delete(local_3b0,local_3a0[0] + 1);
  }
  std::ofstream::ofstream(&local_3b0,(string *)&local_3d0,_S_out);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 != '\0') {
    std::ofstream::close();
    bVar2 = ::fasttext::Args::hasAutotune(&local_1b0);
    if (bVar2) {
      ::fasttext::Autotune::Autotune((Autotune *)&local_418,&local_428);
      ::fasttext::Autotune::train((Autotune *)&local_418,&local_1b0);
      ::fasttext::Autotune::~Autotune((Autotune *)&local_418);
    }
    else {
      local_418._M_unused._M_object = (void *)0x0;
      local_418._8_8_ = 0;
      aaStack_408[0]._M_allocated_capacity = (code *)0x0;
      aaStack_408[0]._8_8_ = 0;
      ::fasttext::FastText::train
                (local_428.super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 ,&local_1b0,(TrainCallback *)&local_418);
      if ((code *)aaStack_408[0]._0_8_ != (code *)0x0) {
        (*(code *)aaStack_408[0]._0_8_)(&local_418,&local_418,3);
      }
    }
    ::fasttext::FastText::saveModel
              (local_428.super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &local_3d0);
    peVar1 = local_428.super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_418._M_unused._M_object = aaStack_408;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_418,local_1b0.output._M_dataplus._M_p,
               local_1b0.output._M_dataplus._M_p + local_1b0.output._M_string_length);
    std::__cxx11::string::append(local_418._M_pod_data);
    ::fasttext::FastText::saveVectors(peVar1,(string *)&local_418);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_unused._0_8_ != aaStack_408) {
      operator_delete(local_418._M_unused._M_object,
                      (ulong)(aaStack_408[0]._M_allocated_capacity + 1));
    }
    peVar1 = local_428.super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (local_1b0.saveOutput == true) {
      local_418._M_unused._M_object = aaStack_408;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_418,local_1b0.output._M_dataplus._M_p,
                 local_1b0.output._M_dataplus._M_p + local_1b0.output._M_string_length);
      std::__cxx11::string::append(local_418._M_pod_data);
      ::fasttext::FastText::saveOutput(peVar1,(string *)&local_418);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_unused._0_8_ != aaStack_408) {
        operator_delete(local_418._M_unused._M_object,
                        (ulong)(aaStack_408[0]._M_allocated_capacity + 1));
      }
    }
    local_3b0 = _VTT;
    *(undefined8 *)(local_3a8 + _VTT[-3] + -8) = _log;
    std::filebuf::~filebuf(local_3a8);
    std::ios_base::~ios_base(local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
      operator_delete(local_3d0._M_dataplus._M_p,
                      CONCAT71(local_3d0.field_2._M_allocated_capacity._1_7_,
                               local_3d0.field_2._M_local_buf[0]) + 1);
    }
    if (local_428.super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_428.super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    ::fasttext::Args::~Args(&local_1b0);
    return;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_418,
                 &local_3d0," cannot be opened for saving.");
  std::invalid_argument::invalid_argument(this,(string *)local_418._M_pod_data);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void train(const std::vector<std::string> args) {
  Args a = Args();
  a.parseArgs(args);
  std::shared_ptr<FastText> fasttext = std::make_shared<FastText>();
  std::string outputFileName;

  if (a.hasAutotune() &&
      a.getAutotuneModelSize() != Args::kUnlimitedModelSize) {
    outputFileName = a.output + ".ftz";
  } else {
    outputFileName = a.output + ".bin";
  }
  std::ofstream ofs(outputFileName);
  if (!ofs.is_open()) {
    throw std::invalid_argument(
        outputFileName + " cannot be opened for saving.");
  }
  ofs.close();
  if (a.hasAutotune()) {
    Autotune autotune(fasttext);
    autotune.train(a);
  } else {
    fasttext->train(a);
  }
  fasttext->saveModel(outputFileName);
  fasttext->saveVectors(a.output + ".vec");
  if (a.saveOutput) {
    fasttext->saveOutput(a.output + ".output");
  }
}